

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O3

bool chrono::utils::LoadConvexMesh
               (string *file_name,ChTriangleMeshConnected *convex_mesh,
               ChConvexDecompositionHACDv2 *convex_shape,ChVector<double> *pos,
               ChQuaternion<double> *rot,int hacd_maxhullcount,int hacd_maxhullmerge,
               int hacd_maxhullvertexes,float hacd_concavity,float hacd_smallclusterthreshold,
               float hacd_fusetolerance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  pointer pCVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  bool bVar11;
  double *pdVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  bVar11 = geometry::ChTriangleMeshConnected::LoadWavefrontMesh(convex_mesh,file_name,true,false);
  if (bVar11) {
    pCVar6 = (convex_mesh->m_vertices).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar13 = (long)(convex_mesh->m_vertices).
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar6;
    if (lVar13 != 0) {
      auVar14 = ZEXT816(0xbff0000000000000);
      auVar15 = ZEXT816(0x4000000000000000);
      lVar13 = (lVar13 >> 3) * -0x5555555555555555;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      pdVar12 = pCVar6->m_data + 2;
      do {
        dVar1 = rot->m_data[0];
        dVar2 = rot->m_data[2];
        dVar3 = rot->m_data[1];
        dVar4 = rot->m_data[3];
        dVar5 = pdVar12[-1];
        auVar26._8_8_ = 0;
        auVar26._0_8_ = ((ChVector<double> *)(pdVar12 + -2))->m_data[0];
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *pdVar12;
        dVar8 = dVar1 * dVar1;
        dVar9 = dVar3 * dVar2 - dVar4 * dVar1;
        dVar7 = dVar3 * dVar2 + dVar4 * dVar1;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar8 + dVar2 * dVar2;
        auVar21 = vfmadd213sd_fma(auVar23,auVar15,auVar14);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dVar8 + dVar3 * dVar3;
        auVar17 = vfmadd213sd_fma(auVar20,auVar15,auVar14);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar5 * (dVar9 + dVar9);
        auVar17 = vfmadd231sd_fma(auVar25,auVar26,auVar17);
        dVar9 = dVar1 * dVar2 + dVar4 * dVar3;
        dVar10 = dVar4 * dVar3 - dVar1 * dVar2;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = dVar7 + dVar7;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dVar5 * auVar21._0_8_;
        auVar16 = vfmadd231sd_fma(auVar24,auVar26,auVar16);
        dVar7 = dVar4 * dVar2 - dVar1 * dVar3;
        dVar2 = dVar1 * dVar3 + dVar4 * dVar2;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar9 + dVar9;
        auVar21 = vfmadd213sd_fma(auVar21,auVar27,auVar17);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = dVar7 + dVar7;
        auVar17 = vfmadd213sd_fma(auVar17,auVar27,auVar16);
        dVar1 = pos->m_data[1];
        auVar18._8_8_ = 0;
        auVar18._0_8_ = dVar10 + dVar10;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar5 * (dVar2 + dVar2);
        auVar18 = vfmadd231sd_fma(auVar22,auVar26,auVar18);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dVar4 * dVar4 + dVar8;
        auVar16 = vfmadd213sd_fma(auVar19,auVar15,auVar14);
        auVar16 = vfmadd213sd_fma(auVar16,auVar27,auVar18);
        dVar2 = pos->m_data[2];
        ((ChVector<double> *)(pdVar12 + -2))->m_data[0] = auVar21._0_8_ + pos->m_data[0];
        pdVar12[-1] = auVar17._0_8_ + dVar1;
        *pdVar12 = auVar16._0_8_ + dVar2;
        pdVar12 = pdVar12 + 3;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    (*(convex_shape->super_ChConvexDecomposition)._vptr_ChConvexDecomposition[2])(convex_shape);
    (*(convex_shape->super_ChConvexDecomposition)._vptr_ChConvexDecomposition[5])
              (convex_shape,convex_mesh);
    collision::ChConvexDecompositionHACDv2::SetParameters
              (convex_shape,hacd_maxhullcount,hacd_maxhullmerge,hacd_maxhullvertexes,hacd_concavity,
               hacd_smallclusterthreshold,hacd_fusetolerance);
    (*(convex_shape->super_ChConvexDecomposition)._vptr_ChConvexDecomposition[6])(convex_shape);
  }
  return bVar11;
}

Assistant:

bool LoadConvexMesh(const std::string& file_name,
                    ChTriangleMeshConnected& convex_mesh,
                    ChConvexDecompositionHACDv2& convex_shape,
                    const ChVector<>& pos,
                    const ChQuaternion<>& rot,
                    int hacd_maxhullcount,
                    int hacd_maxhullmerge,
                    int hacd_maxhullvertexes,
                    float hacd_concavity,
                    float hacd_smallclusterthreshold,
                    float hacd_fusetolerance) {
    if (!convex_mesh.LoadWavefrontMesh(file_name, true, false))
        return false;

    for (int i = 0; i < convex_mesh.m_vertices.size(); i++) {
        convex_mesh.m_vertices[i] = pos + rot.Rotate(convex_mesh.m_vertices[i]);
    }

    convex_shape.Reset();
    convex_shape.AddTriangleMesh(convex_mesh);
    convex_shape.SetParameters(hacd_maxhullcount, hacd_maxhullmerge, hacd_maxhullvertexes, hacd_concavity,
                               hacd_smallclusterthreshold, hacd_fusetolerance);
    convex_shape.ComputeConvexDecomposition();

    return true;
}